

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinSCAN_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double vtb;
  double vta;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double local_68;
  double dStack_60;
  double local_58;
  double vlb;
  double vla;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)N;
  if (N < 1) {
    uVar5 = uVar6;
  }
  lVar4 = 8;
  local_68 = scal_fact;
  dStack_60 = scal_fact;
  local_58 = scal_fact;
  for (; uVar5 << 3 != uVar6; uVar6 = uVar6 + 8) {
    mgga_screening_interface<ExchCXX::BuiltinSCAN_C>::eval_exc_vxc_polar
              (*(double *)((long)rho + uVar6 * 2),*(double *)((long)rho + uVar6 * 2 + 8),
               *(double *)((long)sigma + lVar4 * 2 + -0x10),
               *(double *)((long)sigma + lVar4 * 2 + -8),*(double *)((long)sigma + lVar4 * 2),0.0,
               0.0,*(double *)((long)tau + uVar6 * 2),*(double *)((long)tau + uVar6 * 2 + 8),&e,&vra
               ,&vrb,&vsaa,&vsab,&vsbb,&vla,&vlb,&vta,&vtb);
    *(double *)((long)eps + uVar6) = e * local_58 + *(double *)((long)eps + uVar6);
    pdVar1 = (double *)((long)vrho + uVar6 * 2);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vrho + uVar6 * 2);
    *pdVar2 = vra * local_68 + *pdVar1;
    pdVar2[1] = vrb * dStack_60 + dVar3;
    pdVar1 = (double *)((long)vsigma + lVar4 * 2 + -0x10);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vsigma + lVar4 * 2 + -0x10);
    *pdVar2 = vsaa * local_68 + *pdVar1;
    pdVar2[1] = vsab * dStack_60 + dVar3;
    *(double *)((long)vsigma + lVar4 * 2) = vsbb * local_58 + *(double *)((long)vsigma + lVar4 * 2);
    pdVar1 = (double *)((long)vtau + uVar6 * 2);
    dVar3 = pdVar1[1];
    pdVar2 = (double *)((long)vtau + uVar6 * 2);
    *pdVar2 = vta * local_68 + *pdVar1;
    pdVar2[1] = vtb * dStack_60 + dVar3;
    lVar4 = lVar4 + 0xc;
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;

    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double e, vra, vrb, vsaa,vsab,vsbb, vla, vlb, vta, vtb;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      e, vra, vrb, vsaa, vsab, vsbb, vla, vlb, vta, vtb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;
    vtau_i[0]   += scal_fact * vta;
    vtau_i[1]   += scal_fact * vtb;
    if(traits::needs_laplacian) {
      vlapl_i[0] += scal_fact * vla;
      vlapl_i[1] += scal_fact * vlb;
    }

  }

}